

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.hh
# Opt level: O1

void __thiscall tinyusdz::crate::CrateReader::Node::Node(Node *this)

{
  this->_parent = -2;
  (this->_children).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_children).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_children).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_primChildren)._M_h._M_buckets = &(this->_primChildren)._M_h._M_single_bucket;
  (this->_primChildren)._M_h._M_bucket_count = 1;
  (this->_primChildren)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_primChildren)._M_h._M_element_count = 0;
  (this->_primChildren)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_primChildren)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_primChildren)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_path)._prim_part._M_dataplus._M_p = (pointer)&(this->_path)._prim_part.field_2;
  (this->_path)._prim_part._M_string_length = 0;
  (this->_path)._prim_part.field_2._M_local_buf[0] = '\0';
  (this->_path)._prop_part._M_dataplus._M_p = (pointer)&(this->_path)._prop_part.field_2;
  (this->_path)._prop_part._M_string_length = 0;
  (this->_path)._prop_part.field_2._M_local_buf[0] = '\0';
  (this->_path)._variant_part._M_dataplus._M_p = (pointer)&(this->_path)._variant_part.field_2;
  (this->_path)._variant_part._M_string_length = 0;
  (this->_path)._variant_part.field_2._M_local_buf[0] = '\0';
  (this->_path)._variant_selection_part._M_dataplus._M_p =
       (pointer)&(this->_path)._variant_selection_part.field_2;
  (this->_path)._variant_selection_part._M_string_length = 0;
  (this->_path)._variant_selection_part.field_2._M_local_buf[0] = '\0';
  (this->_path)._variant_part_str._M_dataplus._M_p =
       (pointer)&(this->_path)._variant_part_str.field_2;
  (this->_path)._variant_part_str._M_string_length = 0;
  (this->_path)._variant_part_str.field_2._M_local_buf[0] = '\0';
  (this->_path)._element._M_dataplus._M_p = (pointer)&(this->_path)._element.field_2;
  (this->_path)._element._M_string_length = 0;
  (this->_path)._element.field_2._M_local_buf[0] = '\0';
  (this->_path)._path_type.has_value_ = false;
  (this->_path)._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
  (this->_path)._valid = false;
  (this->_elemPath)._prim_part._M_dataplus._M_p = (pointer)&(this->_elemPath)._prim_part.field_2;
  (this->_elemPath)._prim_part._M_string_length = 0;
  (this->_elemPath)._prim_part.field_2._M_local_buf[0] = '\0';
  (this->_elemPath)._prop_part._M_dataplus._M_p = (pointer)&(this->_elemPath)._prop_part.field_2;
  (this->_elemPath)._prop_part._M_string_length = 0;
  (this->_elemPath)._prop_part.field_2._M_local_buf[0] = '\0';
  (this->_elemPath)._variant_part._M_dataplus._M_p =
       (pointer)&(this->_elemPath)._variant_part.field_2;
  (this->_elemPath)._variant_part._M_string_length = 0;
  (this->_elemPath)._variant_part.field_2._M_local_buf[0] = '\0';
  (this->_elemPath)._variant_selection_part._M_dataplus._M_p =
       (pointer)&(this->_elemPath)._variant_selection_part.field_2;
  (this->_elemPath)._variant_selection_part._M_string_length = 0;
  (this->_elemPath)._variant_selection_part.field_2._M_local_buf[0] = '\0';
  (this->_elemPath)._variant_part_str._M_dataplus._M_p =
       (pointer)&(this->_elemPath)._variant_part_str.field_2;
  (this->_elemPath)._variant_part_str._M_string_length = 0;
  (this->_elemPath)._variant_part_str.field_2._M_local_buf[0] = '\0';
  (this->_elemPath)._element._M_dataplus._M_p = (pointer)&(this->_elemPath)._element.field_2;
  (this->_elemPath)._element._M_string_length = 0;
  (this->_elemPath)._element.field_2._M_local_buf[0] = '\0';
  (this->_elemPath)._path_type.has_value_ = false;
  (this->_elemPath)._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
  (this->_elemPath)._valid = false;
  return;
}

Assistant:

Node() : _parent(-2) {}